

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool normalize_forward_slash(char *path,char *dest)

{
  size_t sVar1;
  char firstbyte;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  
  bVar4 = path != (char *)0x0;
  bVar5 = dest != (char *)0x0;
  if (bVar5 && bVar4) {
    if ((*path == *G_BACKSLASH_CHAR) || (*path == *G_FORWARD_SLASH_CHAR)) {
      path = path + 1;
      *dest = *G_FORWARD_SLASH_CHAR;
      dest = dest + 1;
    }
    firstbyte = *path;
    while (firstbyte != '\0') {
      sVar1 = GetUTF8Length(firstbyte);
      pcVar2 = dest;
      pcVar3 = path;
      if (sVar1 < 2) {
        if ((firstbyte == *G_BACKSLASH_CHAR) || (firstbyte == *G_FORWARD_SLASH_CHAR)) {
          firstbyte = *G_FORWARD_SLASH_CHAR;
        }
        path = path + 1;
        *dest = firstbyte;
        dest = dest + 1;
      }
      else {
        do {
          path = pcVar3 + 1;
          dest = pcVar2 + 1;
          *pcVar2 = *pcVar3;
          sVar1 = sVar1 - 1;
          pcVar2 = dest;
          pcVar3 = path;
        } while (sVar1 != 0);
      }
      firstbyte = *path;
    }
    *dest = '\0';
  }
  return bVar5 && bVar4;
}

Assistant:

bool normalize_forward_slash(const char *path, char *dest)
{
	if (path == NULL || dest == NULL)
	{
		return false;
	}

	const char *p = path;
	char *q = dest;
	if (has_driveletter(path))
	{
		*q++ = *p++;
		*q++ = *p++;
	}
	if ((*p == *G_BACKSLASH_CHAR) || (*p == *G_FORWARD_SLASH_CHAR))
	{
		p++;
		*q++ = *G_FORWARD_SLASH_CHAR;
	}

	while (*p)
	{
		size_t step = GetUTF8Length(*p);
		if (step > 1)
		{
			while (step--)
			{
				*q++ = *p++;
			}
		}
		else if ((*p == *G_BACKSLASH_CHAR) || (*p == *G_FORWARD_SLASH_CHAR))
		{
			p++;
			*q++ = *G_FORWARD_SLASH_CHAR;
		}
		else
		{
			*q++ = *p++;
		}
	}
	*q = '\0';

	return true;
}